

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

SchnorrPubkey *
cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,ByteData256 *tweak,
          Privkey *tweaked_privkey,bool *parity)

{
  pointer puVar1;
  int iVar2;
  undefined8 uVar3;
  CfdException *pCVar4;
  int pk_parity;
  secp256k1_xonly_pubkey x_only_pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_keypair keypair;
  Privkey local_128;
  int local_104;
  secp256k1_xonly_pubkey local_100;
  ByteData local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  uint8_t local_90 [96];
  
  ByteData256::GetBytes(&local_a8,tweak);
  uVar3 = wally_get_secp_context();
  Privkey::GetData(&local_128.data_,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,
                     &local_128.data_);
  iVar2 = secp256k1_keypair_create(uVar3,local_90,local_100.data._0_8_);
  if ((pointer)local_100.data._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_100.data._0_8_);
  }
  if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (iVar2 != 1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100.data._0_8_ = local_100.data + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Invalid private key","")
    ;
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar2 = secp256k1_keypair_xonly_tweak_add
                    (uVar3,local_90,
                     local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (iVar2 != 1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100.data._0_8_ = local_100.data + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Could not tweak add key pair","");
    CfdException::CfdException(pCVar4,kCfdInternalError,(string *)&local_100);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_104 = 0;
  iVar2 = secp256k1_keypair_xonly_pub(uVar3,&local_100,&local_104,local_90);
  if (iVar2 == 1) {
    if (tweaked_privkey != (Privkey *)0x0) {
      ByteData::ByteData(&local_c0,local_90,0x20);
      Privkey::Privkey(&local_128,&local_c0,kMainnet,true);
      puVar1 = (tweaked_privkey->data_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (tweaked_privkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (tweaked_privkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (tweaked_privkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 == (pointer)0x0) {
        tweaked_privkey->is_compressed_ = local_128.is_compressed_;
        *(undefined3 *)&tweaked_privkey->field_0x19 = local_128._25_3_;
        tweaked_privkey->net_type_ = local_128.net_type_;
      }
      else {
        operator_delete(puVar1);
        tweaked_privkey->is_compressed_ = local_128.is_compressed_;
        *(undefined3 *)&tweaked_privkey->field_0x19 = local_128._25_3_;
        tweaked_privkey->net_type_ = local_128.net_type_;
        if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (parity != (bool *)0x0) {
      *parity = local_104 != 0;
    }
    ConvertSchnorrPubkey((ByteData256 *)&local_128,&local_100);
    SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)&local_128);
    if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  CfdException::CfdException(pCVar4,kCfdInternalError);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey SchnorrPubkey::CreateTweakAddFromPrivkey(
    const Privkey &privkey, const ByteData256 &tweak, Privkey *tweaked_privkey,
    bool *parity) {
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  auto ctx = wally_get_secp_context();

  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  ret = secp256k1_keypair_xonly_tweak_add(ctx, &keypair, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add key pair");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);
  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (tweaked_privkey != nullptr) {
    *tweaked_privkey = Privkey(ByteData(keypair.data, Privkey::kPrivkeySize));
  }
  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}